

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
* __thiscall
kj::defer<kj::_::XThreadEvent::ensureDoneOrCanceled()::__1>
          (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
           *__return_storage_ptr__,kj *this,Type *func)

{
  Type *func_00;
  Type *func_local;
  
  func_00 = fwd<kj::_::XThreadEvent::ensureDoneOrCanceled()::__1>
                      ((NoInfer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
                        *)this);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:959:11)>
  ::Deferred(__return_storage_ptr__,func_00);
  return __return_storage_ptr__;
}

Assistant:

_::Deferred<Func> defer(Func&& func) {
  // Returns an object which will invoke the given functor in its destructor. The object is not
  // copyable but is move-constructable with the semantics you'd expect. Since the return type is
  // private, you need to assign to an `auto` variable.
  //
  // The KJ_DEFER macro provides slightly more convenient syntax for the common case where you
  // want some code to run at current scope exit.
  //
  // KJ_DEFER does not support move-assignment for its returned objects. If you need to reuse the
  // variable for your deferred function object, then you will want to write your own class for that
  // purpose.

  return _::Deferred<Func>(kj::fwd<Func>(func));
}